

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clog.c
# Opt level: O2

void internal_logger(logger *log,log_level level,char *fmt,...)

{
  FILE *__stream;
  char in_AL;
  char *pcVar1;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  char *pcVar2;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined8 local_f8;
  void **local_f0;
  undefined1 *local_e8;
  undefined1 local_d8 [24];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  if ((log->min_level <= level) && (log->quiet == false)) {
    __stream = (FILE *)log->stream;
    pcVar2 = "CLOG";
    if (log->name != (char *)0x0) {
      pcVar2 = log->name;
    }
    local_c0 = in_RCX;
    local_b8 = in_R8;
    local_b0 = in_R9;
    pcVar1 = log_level_to_string(level);
    fprintf(__stream,"[%s:%s] - ",pcVar2,pcVar1);
    local_e8 = local_d8;
    local_f0 = &args[0].overflow_arg_area;
    local_f8 = 0x3000000018;
    vfprintf((FILE *)log->stream,fmt,&local_f8);
    fputs("\n",(FILE *)log->stream);
    if ((LEVEL_WARNING < level) && (log->error_handler_func != (error_func_t)0x0)) {
      (*log->error_handler_func)(level);
    }
  }
  return;
}

Assistant:

void internal_logger(const struct logger *log, enum log_level level,
                     const char *fmt, ...)
{
        if (level < log->min_level || log->quiet) {
                return;
        }

        fprintf(log->stream,
                "[%s:%s] - ",
                generate_logging_name(log->name),
                log_level_to_string(level));

        va_list args;
        va_start(args, fmt);
        vfprintf(log->stream, fmt, args);
        va_end(args);

        fputs("\n", log->stream);

        if (level >= LEVEL_ERROR && log->error_handler_func != NULL) {
                log->error_handler_func(level);
        }
}